

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mempool.c
# Opt level: O2

void * pool_malloc(pool_t pool_id,int size)

{
  int iVar1;
  pool_info_t ppVar2;
  pool_node_t ppVar3;
  uint uVar4;
  ulong uVar5;
  undefined8 *elem;
  void *pvVar6;
  pool_node_t *pppVar7;
  ulong uVar8;
  uint uVar9;
  undefined6 in_register_0000003a;
  
  ppVar2 = pools[CONCAT62(in_register_0000003a,pool_id) & 0xffffffff];
  uVar9 = size + 7U & 0xfffffff8;
  uVar4 = prf_array_count(ppVar2->blocks);
  uVar8 = 0;
  uVar5 = (ulong)uVar4;
  if ((int)uVar4 < 1) {
    uVar5 = uVar8;
  }
  do {
    if (uVar5 == uVar8) {
      elem = (undefined8 *)malloc(0x10);
      uVar4 = ppVar2->block_size;
      if (ppVar2->block_size <= (int)uVar9) {
        uVar4 = uVar9;
      }
      *(uint *)(elem + 1) = uVar4;
      *(uint *)((long)elem + 0xc) = uVar9;
      pvVar6 = malloc((long)(int)uVar4);
      *elem = pvVar6;
      pppVar7 = (pool_node_t *)prf_array_append_ptr(ppVar2->blocks,elem);
      ppVar2->blocks = pppVar7;
      return (void *)*elem;
    }
    ppVar3 = ppVar2->blocks[uVar8];
    iVar1 = ppVar3->data_pos;
    uVar8 = uVar8 + 1;
  } while (ppVar3->data_size - iVar1 < (int)uVar9);
  ppVar3->data_pos = uVar9 + iVar1;
  return ppVar3->data + iVar1;
}

Assistant:

void *
pool_malloc(
    pool_t pool_id,
    int size )
{
    int i, num_blocks;
    pool_info_t pool;
    pool_node_t newnode;
    void * ptr;

    assert( (pool_id > 0) && (pool_id < prf_array_count( pools )) );
    assert( pools[ pool_id ] != NULL );

    pool = pools[ pool_id ];
    size = (size + 7) & (~7); /* we're always aligning on eight bytes */

    num_blocks = prf_array_count( pool->blocks );
    for ( i = 0; i < num_blocks; i++ ) {
        if ( size <= (pool->blocks[i]->data_size -
                      pool->blocks[i]->data_pos) ) {
            ptr = pool->blocks[i]->data + pool->blocks[i]->data_pos;
            pool->blocks[i]->data_pos += size;
            return ptr;
        }
    }
    /* need new block */

    newnode = (pool_node_t)malloc( sizeof( struct pool_node_s ) );
    assert( newnode != NULL );
    newnode->data_size = PRF_MAX( pool->block_size, size );
    newnode->data_pos = size;
    newnode->data = (uint8_t *)malloc( newnode->data_size );
    assert( newnode->data != NULL );
    pool->blocks = (pool_node_t *)prf_array_append_ptr(pool->blocks, newnode );
    return newnode->data;
}